

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

object * rd_item(void)

{
  wchar_t wVar1;
  artifact *paVar2;
  ego_item *peVar3;
  monster_race *pmVar4;
  _Bool *p_Var5;
  curse_data *pcVar6;
  quark_t qVar7;
  object_kind *poVar8;
  ulong uVar9;
  long lVar10;
  object *poVar11;
  char *pcVar12;
  uint8_t tmp8u;
  object *obj;
  uint16_t tmp16u;
  uint8_t effect;
  uint8_t ver;
  char buf [128];
  byte local_a9;
  object *local_a8;
  ushort local_9c;
  uint8_t local_9a [130];
  
  local_a8 = object_new();
  local_9a[1] = 1;
  rd_u16b(&local_9c);
  rd_byte(local_9a + 1);
  if (local_9c != 0xffff) {
    return (object *)0x0;
  }
  rd_u16b(&local_a8->oidx);
  rd_byte(&local_a9);
  (local_a8->grid).y = (uint)local_a9;
  rd_byte(&local_a9);
  (local_a8->grid).x = (uint)local_a9;
  rd_string((char *)(local_9a + 2),0x80);
  if (local_9a[2] != '\0') {
    wVar1 = tval_find_idx((char *)(local_9a + 2));
    local_a8->tval = (uint8_t)wVar1;
  }
  rd_string((char *)(local_9a + 2),0x80);
  if (local_9a[2] != '\0') {
    wVar1 = lookup_sval((uint)local_a8->tval,(char *)(local_9a + 2));
    local_a8->sval = (uint8_t)wVar1;
  }
  rd_s16b(&local_a8->pval);
  rd_byte(&local_a8->number);
  rd_s16b(&local_a8->weight);
  rd_string((char *)(local_9a + 2),0x80);
  if (local_9a[2] == '\0') {
LAB_001630c7:
    rd_string((char *)(local_9a + 2),0x80);
    if (local_9a[2] != '\0') {
      peVar3 = lookup_ego_item((char *)(local_9a + 2),(uint)local_a8->tval,(uint)local_a8->sval);
      local_a8->ego = peVar3;
      if (peVar3 == (ego_item *)0x0) {
        pcVar12 = "Couldn\'t find ego item %s!";
        goto LAB_0016351b;
      }
    }
    rd_byte(local_9a);
    rd_s16b(&local_a8->timeout);
    rd_s16b(&local_a8->to_h);
    rd_s16b(&local_a8->to_d);
    rd_s16b(&local_a8->to_a);
    rd_s16b(&local_a8->ac);
    rd_byte(&local_a8->dd);
    rd_byte(&local_a8->ds);
    rd_byte(&local_a8->origin);
    rd_byte(&local_a8->origin_depth);
    rd_string((char *)(local_9a + 2),0x80);
    if (local_9a[2] != '\0') {
      pmVar4 = lookup_monster((char *)(local_9a + 2));
      local_a8->origin_race = pmVar4;
    }
    rd_byte(&local_a8->notice);
    if (of_size != '\0') {
      uVar9 = 0;
      do {
        rd_byte(local_a8->flags + uVar9);
        uVar9 = uVar9 + 1;
      } while (uVar9 < of_size);
    }
    if (obj_mod_max != '\0') {
      lVar10 = 0x52;
      uVar9 = 0;
      do {
        rd_s16b((int16_t *)(local_a8->flags + lVar10 + -0x4c));
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 2;
      } while (uVar9 < obj_mod_max);
    }
    rd_byte(&local_a9);
    if (local_a9 != 0) {
      p_Var5 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
      local_a8->brands = p_Var5;
      if (brand_max != '\0') {
        uVar9 = 0;
        do {
          rd_byte(&local_a9);
          local_a8->brands[uVar9] = local_a9 != 0;
          uVar9 = uVar9 + 1;
        } while (uVar9 < brand_max);
      }
    }
    rd_byte(&local_a9);
    if (local_a9 != 0) {
      p_Var5 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
      local_a8->slays = p_Var5;
      if (slay_max != '\0') {
        uVar9 = 0;
        do {
          rd_byte(&local_a9);
          local_a8->slays[uVar9] = local_a9 != 0;
          uVar9 = uVar9 + 1;
        } while (uVar9 < slay_max);
      }
    }
    rd_byte(&local_a9);
    if (local_a9 != 0) {
      pcVar6 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
      local_a8->curses = pcVar6;
      if (curse_max != '\0') {
        uVar9 = 0;
        do {
          rd_byte(&local_a9);
          local_a8->curses[uVar9].power = (uint)local_a9;
          rd_u16b(&local_9c);
          local_a8->curses[uVar9].timeout = (uint)local_9c;
          uVar9 = uVar9 + 1;
        } while (uVar9 < curse_max);
      }
    }
    if (elem_max != '\0') {
      lVar10 = 0x72;
      uVar9 = 0;
      do {
        rd_s16b((int16_t *)(local_a8->flags + lVar10 + -0x4c));
        rd_byte(local_a8->flags + lVar10 + -0x4a);
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 4;
      } while (uVar9 < elem_max);
    }
    rd_s16b(&local_a8->held_m_idx);
    rd_s16b(&local_a8->mimicking_m_idx);
    rd_u16b(&local_9c);
    if ((ulong)local_9c != 0) {
      local_a8->activation = activations + local_9c;
    }
    rd_u16b(&local_9c);
    (local_a8->time).base = (uint)local_9c;
    rd_u16b(&local_9c);
    (local_a8->time).dice = (uint)local_9c;
    rd_u16b(&local_9c);
    (local_a8->time).sides = (uint)local_9c;
    rd_string((char *)(local_9a + 2),0x80);
    if (local_9a[2] != '\0') {
      qVar7 = quark_add((char *)(local_9a + 2));
      local_a8->note = qVar7;
    }
    poVar8 = lookup_kind((uint)local_a8->tval,(uint)local_a8->sval);
    local_a8->kind = poVar8;
    if (((local_a8->tval == '\0') && (local_a8->sval == '\0')) ||
       (local_a8->kind == (object_kind *)0x0)) {
      poVar11 = (object *)0x0;
      object_delete((chunk *)0x0,(chunk *)0x0,&local_a8);
    }
    else {
      poVar11 = local_a8;
      if (local_9a[0] != '\0') {
        local_a8->effect = local_a8->kind->effect;
      }
    }
  }
  else {
    paVar2 = lookup_artifact_name((char *)(local_9a + 2));
    local_a8->artifact = paVar2;
    if (paVar2 != (artifact *)0x0) goto LAB_001630c7;
    pcVar12 = "Couldn\'t find artifact %s!";
LAB_0016351b:
    poVar11 = (object *)0x0;
    pcVar12 = format(pcVar12,local_9a + 2);
    note(pcVar12);
  }
  return poVar11;
}

Assistant:

static struct object *rd_item(void)
{
	struct object *obj = object_new();

	uint8_t tmp8u;
	uint16_t tmp16u;
	uint8_t effect;
	size_t i;
	char buf[128];
	uint8_t ver = 1;

	rd_u16b(&tmp16u);
	rd_byte(&ver);
	if (tmp16u != 0xffff)
		return NULL;

	rd_u16b(&obj->oidx);

	/* Location */
	rd_byte(&tmp8u);
	obj->grid.y = tmp8u;
	rd_byte(&tmp8u);
	obj->grid.x = tmp8u;

	/* Type/Subtype */
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->tval = tval_find_idx(buf);
	}
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->sval = lookup_sval(obj->tval, buf);
	}
	rd_s16b(&obj->pval);

	rd_byte(&obj->number);
	rd_s16b(&obj->weight);

	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->artifact = lookup_artifact_name(buf);
		if (!obj->artifact) {
			note(format("Couldn't find artifact %s!", buf));
			return NULL;
		}
	}
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->ego = lookup_ego_item(buf, obj->tval, obj->sval);
		if (!obj->ego) {
			note(format("Couldn't find ego item %s!", buf));
			return NULL;
		}
	}
	rd_byte(&effect);

	rd_s16b(&obj->timeout);

	rd_s16b(&obj->to_h);
	rd_s16b(&obj->to_d);
	rd_s16b(&obj->to_a);

	rd_s16b(&obj->ac);

	rd_byte(&obj->dd);
	rd_byte(&obj->ds);

	rd_byte(&obj->origin);
	rd_byte(&obj->origin_depth);
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->origin_race = lookup_monster(buf);
	}
	rd_byte(&obj->notice);

	for (i = 0; i < of_size; i++)
		rd_byte(&obj->flags[i]);

	for (i = 0; i < obj_mod_max; i++) {
		rd_s16b(&obj->modifiers[i]);
	}

	/* Read brands */
	rd_byte(&tmp8u);
	if (tmp8u) {
		obj->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
		for (i = 0; i < brand_max; i++) {
			rd_byte(&tmp8u);
			obj->brands[i] = tmp8u ? true : false;
		}
	}

	/* Read slays */
	rd_byte(&tmp8u);
	if (tmp8u) {
		obj->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
		for (i = 0; i < slay_max; i++) {
			rd_byte(&tmp8u);
			obj->slays[i] = tmp8u ? true : false;
		}
	}

	/* Read curses */
	rd_byte(&tmp8u);
	if (tmp8u) {
		obj->curses = mem_zalloc(z_info->curse_max * sizeof(struct curse_data));
		for (i = 0; i < curse_max; i++) {
			rd_byte(&tmp8u);
			obj->curses[i].power = tmp8u;
			rd_u16b(&tmp16u);
			obj->curses[i].timeout = tmp16u;
		}
	}

	for (i = 0; i < elem_max; i++) {
		rd_s16b(&obj->el_info[i].res_level);
		rd_byte(&obj->el_info[i].flags);
	}

	/* Monster holding object */
	rd_s16b(&obj->held_m_idx);

	rd_s16b(&obj->mimicking_m_idx);

	/* Activation */
	rd_u16b(&tmp16u);
	if (tmp16u)
		obj->activation = &activations[tmp16u];
	rd_u16b(&tmp16u);
	obj->time.base = tmp16u;
	rd_u16b(&tmp16u);
	obj->time.dice = tmp16u;
	rd_u16b(&tmp16u);
	obj->time.sides = tmp16u;

	/* Save the inscription */
	rd_string(buf, sizeof(buf));
	if (buf[0]) obj->note = quark_add(buf);

	/* Lookup item kind */
	obj->kind = lookup_kind(obj->tval, obj->sval);

	/* Check we have a kind */
	if ((!obj->tval && !obj->sval) || !obj->kind) {
		object_delete(NULL, NULL, &obj);
		return NULL;
	}

	/* Set effect */
	if (effect)
		obj->effect = obj->kind->effect;

	/* Success */
	return obj;
}